

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merlin.cpp
# Opt level: O3

bool __thiscall Merlin::read_virtual_evidence(Merlin *this,char *filename)

{
  istream *piVar1;
  mapped_type *this_00;
  runtime_error *this_01;
  ulong uVar2;
  int iVar3;
  int num_evid;
  size_t dom;
  string err_msg;
  vindex var;
  ifstream in;
  int local_274;
  size_type local_270;
  vector<double,_std::allocator<double>_> local_268;
  map<unsigned_long,_std::vector<double,_std::allocator<double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<double,_std::allocator<double>_>_>_>_>
  *local_248;
  key_type local_240;
  double local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,filename,_S_in);
  if ((abStack_218[*(long *)((long)local_238[0] + -0x18)] & 5) == 0) {
    local_248 = &this->m_virtualEvidence;
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<double,_std::allocator<double>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<double,_std::allocator<double>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<double,_std::allocator<double>_>_>_>_>
    ::clear(&local_248->_M_t);
    std::istream::operator>>(local_238,&local_274);
    if (0 < local_274) {
      iVar3 = 0;
      do {
        local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        piVar1 = std::istream::_M_extract<unsigned_long>((ulong *)local_238);
        std::istream::_M_extract<unsigned_long>((ulong *)piVar1);
        std::vector<double,_std::allocator<double>_>::resize(&local_268,local_270);
        if (local_270 != 0) {
          uVar2 = 0;
          do {
            std::istream::_M_extract<double>(local_238);
            uVar2 = uVar2 + 1;
          } while (uVar2 < local_270);
        }
        this_00 = std::
                  map<unsigned_long,_std::vector<double,_std::allocator<double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<double,_std::allocator<double>_>_>_>_>
                  ::operator[](local_248,&local_240);
        std::vector<double,_std::allocator<double>_>::operator=(this_00,&local_268);
        if (local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 < local_274);
    }
    std::ifstream::close();
    std::ifstream::~ifstream(local_238);
    return true;
  }
  local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Cannot open the virtual evidence file: ","");
  std::__cxx11::string::append((char *)&local_268);
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,(string *)&local_268);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool Merlin::read_virtual_evidence(const char* filename) {
	try {

		// Open the evidence file
		std::ifstream in(filename);
		if (in.fail()) {
			std::string err_msg("Cannot open the virtual evidence file: ");
			err_msg += filename;
			throw std::runtime_error(err_msg);
		}

		// Clear any previous virtual evidence
		m_virtualEvidence.clear();

		// Read the virtual evidence file
		int num_evid;
		in >> num_evid;
		for (int i = 0; i < num_evid; ++i) {
			vindex var;
			size_t dom;
			likelihood l;
			in >> var >> dom;
			l.resize(dom);
			for (size_t k = 0; k < dom; ++k) {
				in >> l[k];
			}

			m_virtualEvidence[var] = l;
		}

		// Close the evidence file
		in.close();

		return true;
	} catch (const std::runtime_error& e) {
		std::cerr << e.what() << std::endl;
		return false;
	}
}